

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O0

string * __thiscall
benchmark::StringPrintFImp_abi_cxx11_
          (string *__return_storage_ptr__,benchmark *this,char *msg,__va_list_tag *args)

{
  pointer pvVar1;
  char *__p;
  pointer pcVar2;
  allocator local_161;
  unique_ptr<char[],_std::default_delete<char[]>_> local_160;
  unique_ptr<char[],_std::default_delete<char[]>_> buff_ptr;
  allocator local_145;
  int local_144;
  ulong uStack_140;
  int ret;
  size_t size;
  array<char,_256UL> local_buff;
  va_list args_cp;
  __va_list_tag *args_local;
  char *msg_local;
  
  local_buff._M_elems._248_8_ = *(undefined8 *)msg;
  uStack_140 = std::array<char,_256UL>::size((array<char,_256UL> *)&size);
  pvVar1 = std::array<char,_256UL>::data((array<char,_256UL> *)&size);
  local_144 = vsnprintf(pvVar1,uStack_140,(char *)this,local_buff._M_elems + 0xf8);
  if (local_144 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else if ((ulong)(long)local_144 < uStack_140) {
    pvVar1 = std::array<char,_256UL>::data((array<char,_256UL> *)&size);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pvVar1,&local_145);
    std::allocator<char>::~allocator((allocator<char> *)&local_145);
  }
  else {
    uStack_140 = (long)local_144 + 1;
    __p = (char *)operator_new__(uStack_140);
    std::unique_ptr<char[],std::default_delete<char[]>>::
    unique_ptr<char*,std::default_delete<char[]>,void,bool>
              ((unique_ptr<char[],std::default_delete<char[]>> *)&local_160,__p);
    pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_160);
    local_144 = vsnprintf(pcVar2,uStack_140,(char *)this,msg);
    pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_160);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_161);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&local_160);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringPrintFImp(const char *msg, va_list args)
{
  // we might need a second shot at this, so pre-emptivly make a copy
  va_list args_cp;
  va_copy(args_cp, args);

  // TODO(ericwf): use std::array for first attempt to avoid one memory
  // allocation guess what the size might be
  std::array<char, 256> local_buff;
  std::size_t size = local_buff.size();
  // 2015-10-08: vsnprintf is used instead of snd::vsnprintf due to a limitation in the android-ndk
  auto ret = vsnprintf(local_buff.data(), size, msg, args_cp);

  va_end(args_cp);

  // handle empty expansion
  if (ret == 0)
    return std::string{};
  if (static_cast<std::size_t>(ret) < size)
    return std::string(local_buff.data());

  // we did not provide a long enough buffer on our first attempt.
  // add 1 to size to account for null-byte in size cast to prevent overflow
  size = static_cast<std::size_t>(ret) + 1;
  auto buff_ptr = std::unique_ptr<char[]>(new char[size]);
  // 2015-10-08: vsnprintf is used instead of snd::vsnprintf due to a limitation in the android-ndk
  ret = vsnprintf(buff_ptr.get(), size, msg, args);
  return std::string(buff_ptr.get());
}